

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::a64::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  CallConv *this_00;
  Error EVar4;
  RegMask RVar5;
  FuncValuePack *this_01;
  FuncValue *pFVar6;
  Operand *pOVar7;
  OperandSignature *pOVar8;
  uint *puVar9;
  uint32_t useId;
  RAWorkReg *workReg_00;
  uint32_t argIndex;
  ulong argIndex_00;
  RAInstBuilder *this_02;
  uint32_t valueIndex;
  size_t sVar10;
  bool bVar11;
  RegType local_65;
  Error local_64;
  RAWorkReg *workReg;
  ulong local_58;
  RAInstBuilder *local_50;
  RACFGBuilder *local_48;
  CallConv *local_40;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_38;
  
  local_40 = (CallConv *)&invokeNode->_funcDetail;
  local_58 = (ulong)(byte)invokeNode->field_0xf4;
  argIndex_00 = 0;
  local_38 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + 0x524);
  local_64 = 3;
  local_50 = ib;
  local_48 = this;
  do {
    if (argIndex_00 == local_58) {
      bVar11 = false;
LAB_00132e04:
      if (!bVar11) {
        sVar10 = 0;
        local_64 = 0x19;
        while ((sVar10 != 4 &&
               (pFVar6 = FuncValuePack::operator[]((FuncValuePack *)&invokeNode->field_0x10c,sVar10)
               , pFVar6->_data != 0))) {
          pOVar7 = InvokeNode::OperandPack::operator[](&invokeNode->_rets,sVar10);
          if (((pOVar7->super_Operand_)._signature._bits & 7) == 1) {
            EVar4 = BaseRAPass::virtIndexAsWorkReg
                              ((this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                               (pOVar7->super_Operand_)._baseId - 0x100,&workReg);
            if (EVar4 != 0) {
              return EVar4;
            }
            if ((pFVar6->_data >> 8 & 1) == 0) {
              return local_64;
            }
            uVar2 = *(uint *)(CONCAT44(workReg._4_4_,workReg._0_4_) + 0x20);
            local_65 = (RegType)(pFVar6->_data >> 0x18);
            pOVar8 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                (_archTraits + 0x524),&local_65);
            this = local_48;
            if ((((uVar2 ^ pOVar8->_bits) & 0xf00) == 0) &&
               (EVar4 = RAInstBuilder::addCallRet
                                  (local_50,(RAWorkReg *)CONCAT44(workReg._4_4_,workReg._0_4_),
                                   (uint)*(byte *)((long)&pFVar6->_data + 2)), this = local_48,
               EVar4 != 0)) {
              return EVar4;
            }
          }
          sVar10 = sVar10 + 1;
        }
        this_00 = local_40;
        bVar1 = (((this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass)->
                _physRegCount).field_0._regs[0];
        local_64 = 0;
        RVar5 = CallConv::preservedRegs(local_40,k0);
        this_02 = local_50 + 0x28;
        workReg._0_4_ = 0;
        puVar9 = Support::Array<unsigned_int,_4UL>::operator[]<int>
                           ((Array<unsigned_int,_4UL> *)this_02,(int *)&workReg);
        *puVar9 = ~(RVar5 | (uint)(-1L << (bVar1 & 0x3f)));
        bVar1 = (((this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass)->
                _physRegCount).field_0._regs[1];
        RVar5 = CallConv::preservedRegs(this_00,kVec);
        workReg._0_4_ = 1;
        puVar9 = Support::Array<unsigned_int,_4UL>::operator[]<int>
                           ((Array<unsigned_int,_4UL> *)this_02,(int *)&workReg);
        *puVar9 = ~(RVar5 | (uint)(-1L << (bVar1 & 0x3f)));
        bVar1 = (((this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass)->
                _physRegCount).field_0._regs[2];
        RVar5 = CallConv::preservedRegs(this_00,kMask);
        workReg._0_4_ = 2;
        puVar9 = Support::Array<unsigned_int,_4UL>::operator[]<int>
                           ((Array<unsigned_int,_4UL> *)this_02,(int *)&workReg);
        *puVar9 = ~(RVar5 | (uint)(-1L << (bVar1 & 0x3f)));
        bVar1 = (((this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass)->
                _physRegCount).field_0._regs[3];
        RVar5 = CallConv::preservedRegs(this_00,kExtraVirt3);
        workReg._0_4_ = 3;
        puVar9 = Support::Array<unsigned_int,_4UL>::operator[]<int>
                           ((Array<unsigned_int,_4UL> *)this_02,(int *)&workReg);
        *puVar9 = ~(RVar5 | (uint)(-1L << (bVar1 & 0x3f)));
      }
      return local_64;
    }
    this_01 = FuncDetail::argPack((FuncDetail *)local_40,argIndex_00);
    for (sVar10 = 0; sVar10 != 4; sVar10 = sVar10 + 1) {
      pFVar6 = FuncValuePack::operator[](this_01,sVar10);
      if (pFVar6->_data != 0) {
        pFVar6 = FuncValuePack::operator[](this_01,sVar10);
        pOVar7 = InvokeNode::arg(invokeNode,argIndex_00,sVar10);
        if (((pOVar7->super_Operand_)._signature._bits & 7) == 1) {
          EVar4 = BaseRAPass::virtIndexAsWorkReg
                            ((this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                             (pOVar7->super_Operand_)._baseId - 0x100,&workReg);
          if (EVar4 == 0) {
            uVar2 = pFVar6->_data;
            if ((uVar2 >> 10 & 1) == 0) {
              if ((uVar2 >> 8 & 1) != 0) {
                uVar3 = *(uint *)(CONCAT44(workReg._4_4_,workReg._0_4_) + 0x20);
                local_65 = (RegType)(uVar2 >> 0x18);
                pOVar8 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>(local_38,&local_65);
                this = local_48;
                if (((uVar3 ^ pOVar8->_bits) & 0xf00) == 0) {
                  workReg_00 = (RAWorkReg *)CONCAT44(workReg._4_4_,workReg._0_4_);
                  useId = (uint32_t)*(byte *)((long)&pFVar6->_data + 2);
                  goto LAB_00132dd2;
                }
              }
              goto LAB_00132de0;
            }
            workReg_00 = (RAWorkReg *)CONCAT44(workReg._4_4_,workReg._0_4_);
            EVar4 = local_64;
            if (((byte)workReg_00[0x21] & 0xf) == 0) {
              useId = uVar2 >> 0x10 & 0xff;
LAB_00132dd2:
              EVar4 = RAInstBuilder::addCallArg(local_50,workReg_00,useId);
              if (EVar4 == 0) goto LAB_00132de0;
            }
          }
          local_64 = EVar4;
          bVar11 = argIndex_00 < local_58;
          goto LAB_00132e04;
        }
      }
LAB_00132de0:
    }
    argIndex_00 = argIndex_00 + 1;
  } while( true );
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    const Operand& op = invokeNode->ret(retIndex);
    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  ib._clobbered[0] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(0)]) & ~fd.preservedRegs(RegGroup(0));
  ib._clobbered[1] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(1)]) & ~fd.preservedRegs(RegGroup(1));
  ib._clobbered[2] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(2)]) & ~fd.preservedRegs(RegGroup(2));
  ib._clobbered[3] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(3)]) & ~fd.preservedRegs(RegGroup(3));

  return kErrorOk;
}